

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

bool __thiscall QMenu::isTearOffMenuVisible(QMenu *this)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(long *)(lVar1 + 0x318) != 0) && (*(int *)(*(long *)(lVar1 + 0x318) + 4) != 0)) &&
     (*(long *)(lVar1 + 800) != 0)) {
    return (bool)(*(byte *)(*(long *)(*(long *)(lVar1 + 800) + 0x20) + 9) >> 7);
  }
  return false;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }